

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O3

void chaiscript::Name_Validator::validate_object_name<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name)

{
  pointer pcVar1;
  bool bVar2;
  size_type sVar3;
  reserved_word_error *this;
  illegal_name_error *this_00;
  string local_38;
  
  bVar2 = is_reserved_word<std::__cxx11::string>(name);
  if (bVar2) {
    this = (reserved_word_error *)__cxa_allocate_exception(0x30);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    pcVar1 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,pcVar1 + name->_M_string_length);
    exception::reserved_word_error::reserved_word_error(this,&local_38);
    __cxa_throw(this,&exception::reserved_word_error::typeinfo,
                exception::reserved_word_error::~reserved_word_error);
  }
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (name,"::",0,2);
  if (sVar3 == 0xffffffffffffffff) {
    return;
  }
  this_00 = (illegal_name_error *)__cxa_allocate_exception(0x30);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + name->_M_string_length);
  exception::illegal_name_error::illegal_name_error(this_00,&local_38);
  __cxa_throw(this_00,&exception::illegal_name_error::typeinfo,
              exception::illegal_name_error::~illegal_name_error);
}

Assistant:

static void validate_object_name(const T &name) {
      if (is_reserved_word(name)) {
        throw exception::reserved_word_error(std::string(name));
      }

      if (name.find("::") != std::string::npos) {
        throw exception::illegal_name_error(std::string(name));
      }
    }